

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapTest.cpp
# Opt level: O0

void print<std::map<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>>>
               (map<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>_> *t,
               char *s)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  _Self local_38;
  _Base_ptr local_30;
  int local_24;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> local_20;
  const_iterator it;
  char *s_local;
  map<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>_> *t_local;
  
  it._M_node = (_Base_ptr)s;
  std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::_Rb_tree_const_iterator(&local_20);
  local_24 = (int)std::setw(3);
  poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)local_24);
  poVar2 = std::operator<<(poVar2,(char *)it._M_node);
  std::operator<<(poVar2," contains:");
  local_30 = (_Base_ptr)
             std::map<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             begin(t);
  local_20._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>_>::end(t);
    bVar1 = std::operator!=(&local_20,&local_38);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout," (");
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->(&local_20);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->first);
    poVar2 = std::operator<<(poVar2," => ");
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->(&local_20);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->second);
    std::operator<<(poVar2,')');
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator++(&local_20);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void	print(T const & t, char const * s)
{
	typename T::const_iterator	it;

	std::cout << std::setw(3) << s << " contains:";
	for (it = t.begin(); it != t.end(); ++it)
		std::cout << " (" << it->first << " => " << it->second << ')';
	std::cout << std::endl;
}